

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall HashUtil_Ripemd160_Test::TestBody(HashUtil_Ripemd160_Test *this)

{
  char *pcVar1;
  allocator local_99;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  AssertionResult gtest_ar;
  Script local_60;
  ByteData160 byte_data;
  
  cfd::core::ByteData160::ByteData160(&byte_data);
  std::__cxx11::string::string((string *)&local_60,"0123456789abcdef",&local_99);
  cfd::core::ByteData::ByteData((ByteData *)&local_98,(string *)&local_60);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&gtest_ar,(ByteData *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&byte_data.data_,&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_60,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"cea1b21f1a739fba68d1d4290437d2c5609be1d3\"",(char *)local_60._vptr_Script,
             "cea1b21f1a739fba68d1d4290437d2c5609be1d3");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string
            ((string *)&local_60,"0123456789abcdef0123456789abcdef01234567",&local_99);
  cfd::core::ByteData160::ByteData160((ByteData160 *)&local_98,(string *)&local_60);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&gtest_ar,(ByteData160 *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&byte_data.data_,&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_60,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"49ec9207a365f6f330d529ca2a79e23a7ea2b526\"",(char *)local_60._vptr_Script,
             "49ec9207a365f6f330d529ca2a79e23a7ea2b526");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string
            ((string *)&local_60,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_99);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_98,(string *)&local_60);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&gtest_ar,(ByteData256 *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&byte_data.data_,&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_60,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"a5b1c86f10c81c3c543304e9891815d8de036296\"",(char *)local_60._vptr_Script,
             "a5b1c86f10c81c3c543304e9891815d8de036296");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string
            ((string *)&local_60,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db",&local_99);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_98,(string *)&local_60);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&gtest_ar,(Pubkey *)&local_98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&byte_data.data_,&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_60,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca\"",(char *)local_60._vptr_Script,
             "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x30,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,&local_99);
  cfd::core::Script::Script(&local_60,(string *)&gtest_ar);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_98,&local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&byte_data.data_,&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  cfd::core::Script::~Script(&local_60);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_60,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"6be854f95bade5490a020c3841c50d08339a5c89\"",(char *)local_60._vptr_Script,
             "6be854f95bade5490a020c3841c50d08339a5c89");
  std::__cxx11::string::~string((string *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  return;
}

Assistant:

TEST(HashUtil, Ripemd160) {
  ByteData160 byte_data;
  byte_data = HashUtil::Ripemd160(ByteData("0123456789abcdef"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "cea1b21f1a739fba68d1d4290437d2c5609be1d3");

  byte_data = HashUtil::Ripemd160(ByteData160("0123456789abcdef0123456789abcdef01234567"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  byte_data = HashUtil::Ripemd160(ByteData256("1234567890123456789012345678901234567890123456789012345678901234"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "a5b1c86f10c81c3c543304e9891815d8de036296");

  byte_data = HashUtil::Ripemd160(Pubkey("032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");

  byte_data = HashUtil::Ripemd160(Script("21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "6be854f95bade5490a020c3841c50d08339a5c89");
}